

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeof.h
# Opt level: O1

TypeInfo *
dap::
TypeOf<dap::variant<dap::integer,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::type(void)

{
  int iVar1;
  
  if (TypeOf<dap::variant<dap::integer,std::__cxx11::string>>::type()::typeinfo_abi_cxx11_ == '\0')
  {
    iVar1 = __cxa_guard_acquire(&TypeOf<dap::variant<dap::integer,std::__cxx11::string>>::type()::
                                 typeinfo_abi_cxx11_);
    if (iVar1 != 0) {
      TypeOf<dap::variant<dap::integer,std::__cxx11::string>>::type()::typeinfo_abi_cxx11_ =
           TypeInfo::
           create<dap::BasicTypeInfo<dap::variant<dap::integer,std::__cxx11::string>>,char_const(&)[8]>
                     ((char (*) [8])0x7d6422);
      __cxa_guard_release(&TypeOf<dap::variant<dap::integer,std::__cxx11::string>>::type()::
                           typeinfo_abi_cxx11_);
    }
  }
  return &TypeOf<dap::variant<dap::integer,std::__cxx11::string>>::type()::typeinfo_abi_cxx11_->
          super_TypeInfo;
}

Assistant:

static inline const TypeInfo* type() {
    static auto typeinfo =
        TypeInfo::create<BasicTypeInfo<variant<T0, Types...>>>("variant");
    return typeinfo;
  }